

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_archive.cpp
# Opt level: O1

bool __thiscall ON_SubDVertex::Write(ON_SubDVertex *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = WriteBase(&this->super_ON_SubDComponentBase,archive);
  if ((bVar1) && (bVar1 = ON_BinaryArchive::WriteChar(archive,this->m_vertex_tag), bVar1)) {
    bVar1 = ON_BinaryArchive::WriteDouble(archive,3,this->m_P);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::WriteShort(archive,this->m_edge_count);
      if ((((bVar1) && (bVar1 = ON_BinaryArchive::WriteShort(archive,this->m_face_count), bVar1)) &&
          (bVar1 = ON_BinaryArchive::WriteChar(archive,'\0'), bVar1)) &&
         ((bVar1 = Internal_WriteEdgePtrList
                             (this->m_edge_count,this->m_edge_capacity,this->m_edges,0,
                              (ON_SubDEdgePtr *)0x0,archive), bVar1 &&
          (bVar1 = Internal_WriteFacePtrList
                             (this->m_face_count,(ulong)this->m_face_capacity,
                              (ON_SubDFacePtr *)this->m_faces,0,(ON_SubDFacePtr *)0x0,archive),
          bVar1)))) {
        iVar2 = ON_BinaryArchive::Archive3dmVersion(archive);
        if (0x45 < iVar2) {
          bVar1 = Internal_FinishWritingComponentAdditions(archive);
          return bVar1;
        }
        bVar1 = ON_BinaryArchive::WriteChar(archive,'\0');
        if (bVar1) {
          return true;
        }
      }
    }
    else {
      ON_SubDIncrementErrorCount();
    }
  }
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

bool ON_SubDVertex::Write(
  ON_BinaryArchive& archive
  ) const
{
  for (;;)
  {
    if (!WriteBase(this,archive))
      break;
    if (!archive.WriteChar((unsigned char)m_vertex_tag))
      break;
    if (!Internal_WriteDouble3(m_P,archive))
      break;
    if (!archive.WriteShort(m_edge_count))
      break;
    if (!archive.WriteShort(m_face_count))
      break;
    
    // Dale Lear 2024-12-18
    // Due to a bug in ON_SubDVertex::Read(), the limit points written
    // by Internal_WriteSavedLimitPointList() were read but never used.
    // It appears that recalculating the limit points every time the
    // file is read is working out just fine. So writing a zero byte
    // here means that old code will be able to read new files and
    // we wont' waste time and disk space saving limit points.
    if (!archive.WriteChar((unsigned char)0))
      break;
    //if (!Internal_WriteSavedLimitPointList(m_face_count, this->SurfacePointIsSet(), m_limit_point, archive))
    //  break;

    if (!Internal_WriteEdgePtrList(m_edge_count,m_edge_capacity,m_edges,0,nullptr, archive))
      break;
    if (!Internal_WriteFacePtrList(m_face_count,m_face_capacity,(const ON_SubDFacePtr*)m_faces,0,nullptr, archive))
      break;

    if (archive.Archive3dmVersion() < 70)
    {
      // mark end with a 0 byte
      if (!archive.WriteChar((unsigned char)0U))
        break;
      return true;
    }


    return Internal_FinishWritingComponentAdditions(archive);
  }
  return ON_SUBD_RETURN_ERROR(false);
}